

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O0

void __thiscall higan::InetAddress::InetAddress(InetAddress *this)

{
  allocator<char> local_31;
  string local_30;
  InetAddress *local_10;
  InetAddress *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FF.FF.FF.FF",&local_31);
  InetAddress(this,&local_30,-1);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

InetAddress::InetAddress():
	InetAddress("FF.FF.FF.FF", -1)
{

}